

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_pow22523.c
# Opt level: O0

void crypto_sign_ed25519_ref10_fe_pow22523(int32_t *out,int32_t *z)

{
  int i;
  fe t2;
  fe t1;
  fe t0;
  int32_t *in_stack_00000188;
  int32_t *in_stack_00000190;
  int32_t *in_stack_00000318;
  int32_t *in_stack_00000320;
  int32_t *in_stack_00000328;
  undefined4 local_9c;
  
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 1; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 2; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 1; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 5; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 10; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 0x14; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 10; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 0x32; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 100; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 0x32; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  for (local_9c = 1; local_9c < 2; local_9c = local_9c + 1) {
    crypto_sign_ed25519_ref10_fe_sq(in_stack_00000190,in_stack_00000188);
  }
  crypto_sign_ed25519_ref10_fe_mul(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  return;
}

Assistant:

void fe_pow22523(fe out,const fe z)
{
  fe t0;
  fe t1;
  fe t2;
  int i;

#include "pow22523.h"

  return;
}